

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

bool __thiscall
libtorrent::torrent_info::parse_piece_layers(torrent_info *this,bdecode_node *e,error_code *ec)

{
  bdecode_node *this_00;
  ulong uVar1;
  type_t tVar2;
  int iVar3;
  uint uVar4;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar5;
  int64_t iVar6;
  iterator iVar7;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar8;
  iterator iVar9;
  size_t sVar10;
  bool bVar11;
  file_index_t i;
  file_index_t fVar12;
  long lVar13;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> sVar14;
  int iVar15;
  _Head_base<0UL,_const_libtorrent::file_storage_*,_false> this_01;
  error_code eVar16;
  error_code eVar17;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> f;
  set<libtorrent::digest32<256L>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
  all_file_roots;
  map<libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  piece_layers;
  sha256_hash root;
  string_view local_130;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> local_120;
  _Rb_tree<libtorrent::digest32<256L>,_libtorrent::digest32<256L>,_std::_Identity<libtorrent::digest32<256L>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
  local_d0;
  _Rb_tree<libtorrent::digest32<256L>,_std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::_Select1st<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_a0;
  digest32<256L> local_70;
  key_type local_50;
  
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  tVar2 = bdecode_node::type(e);
  if (tVar2 != dict_t) {
    eVar16 = errors::make_error_code(torrent_missing_piece_layer);
    ec->val_ = eVar16.val_;
    ec->failed_ = eVar16.failed_;
    *(int3 *)&ec->field_0x5 = eVar16._5_3_;
    ec->cat_ = eVar16.cat_;
    bVar11 = false;
    goto LAB_00369626;
  }
  local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d0._M_impl.super__Rb_tree_header._M_header;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar15 = 0;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01._M_head_impl =
       (this->m_orig_files).m_ptr._M_t.
       super___uniq_ptr_impl<const_libtorrent::file_storage,_std::default_delete<const_libtorrent::file_storage>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_libtorrent::file_storage_*,_std::default_delete<const_libtorrent::file_storage>_>
       .super__Head_base<0UL,_const_libtorrent::file_storage_*,_false>._M_head_impl;
  if ((torrent_info *)this_01._M_head_impl == (torrent_info *)0x0) {
    this_01._M_head_impl = &this->m_files;
  }
  local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar5 = file_storage::file_range(this_01._M_head_impl);
  sVar14 = iVar5._end.m_val;
  if (iVar5._begin.m_val.m_val != sVar14.m_val) {
    do {
      fVar12.m_val = (int)iVar5._begin.m_val;
      iVar6 = file_storage::file_size(this_01._M_head_impl,fVar12);
      if (((file_storage *)&(this_01._M_head_impl)->m_piece_length)->m_piece_length < iVar6) {
        file_storage::root((sha256_hash *)&local_120,this_01._M_head_impl,fVar12);
        ::std::
        _Rb_tree<libtorrent::digest32<256l>,libtorrent::digest32<256l>,std::_Identity<libtorrent::digest32<256l>>,std::less<libtorrent::digest32<256l>>,std::allocator<libtorrent::digest32<256l>>>
        ::_M_insert_unique<libtorrent::digest32<256l>>
                  ((_Rb_tree<libtorrent::digest32<256l>,libtorrent::digest32<256l>,std::_Identity<libtorrent::digest32<256l>>,std::less<libtorrent::digest32<256l>>,std::allocator<libtorrent::digest32<256l>>>
                    *)&local_d0,(digest32<256L> *)&local_120);
      }
      iVar5._begin.m_val = fVar12.m_val + 1;
      iVar5._end.m_val = 0;
    } while (sVar14.m_val != iVar5._begin.m_val);
  }
  this_00 = &local_120.second;
  do {
    iVar3 = bdecode_node::dict_size(e);
    if (iVar3 <= iVar15) {
      iVar15 = file_storage::num_files(this_01._M_head_impl);
      ::std::
      vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
      ::resize(&(this->m_piece_layers).
                super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
               ,(long)iVar15);
      iVar8 = file_storage::file_range(this_01._M_head_impl);
      sVar14 = iVar8._end.m_val;
      if (iVar8._begin.m_val.m_val == sVar14.m_val) goto LAB_0036971d;
      lVar13 = (long)iVar8._begin.m_val.m_val * 0x18;
      goto LAB_00369696;
    }
    bdecode_node::dict_at(&local_120,e,iVar15);
    if (((local_120.first._M_len != 0x20) ||
        (tVar2 = bdecode_node::type(this_00), tVar2 != string_t)) ||
       (uVar4 = bdecode_node::string_length(this_00), (uVar4 & 0x1f) != 0)) {
      eVar16 = errors::make_error_code(torrent_invalid_piece_layer);
      ec->val_ = eVar16.val_;
      ec->failed_ = eVar16.failed_;
      *(int3 *)&ec->field_0x5 = eVar16._5_3_;
      ec->cat_ = eVar16.cat_;
      if (local_120.second.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.second.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_120.second.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_120.second.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      break;
    }
    sVar10 = local_120.first._M_len;
    if (0x1f < (long)local_120.first._M_len) {
      sVar10 = 0x20;
    }
    memcpy(&local_50,local_120.first._M_str,sVar10);
    iVar7 = ::std::
            _Rb_tree<libtorrent::digest32<256L>,_libtorrent::digest32<256L>,_std::_Identity<libtorrent::digest32<256L>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
            ::find(&local_d0,&local_50);
    if ((_Rb_tree_header *)iVar7._M_node == &local_d0._M_impl.super__Rb_tree_header) {
      eVar16 = errors::make_error_code(torrent_invalid_piece_layer);
      ec->val_ = eVar16.val_;
      ec->failed_ = eVar16.failed_;
      *(int3 *)&ec->field_0x5 = eVar16._5_3_;
      ec->cat_ = eVar16.cat_;
    }
    else {
      sVar10 = local_120.first._M_len;
      if (0x1f < (long)local_120.first._M_len) {
        sVar10 = 0x20;
      }
      memcpy(&local_70,local_120.first._M_str,sVar10);
      local_130 = bdecode_node::string_value(this_00);
      ::std::
      _Rb_tree<libtorrent::digest32<256l>,std::pair<libtorrent::digest32<256l>const,std::basic_string_view<char,std::char_traits<char>>>,std::_Select1st<std::pair<libtorrent::digest32<256l>const,std::basic_string_view<char,std::char_traits<char>>>>,std::less<libtorrent::digest32<256l>>,std::allocator<std::pair<libtorrent::digest32<256l>const,std::basic_string_view<char,std::char_traits<char>>>>>
      ::
      _M_emplace_unique<libtorrent::digest32<256l>,std::basic_string_view<char,std::char_traits<char>>>
                ((_Rb_tree<libtorrent::digest32<256l>,std::pair<libtorrent::digest32<256l>const,std::basic_string_view<char,std::char_traits<char>>>,std::_Select1st<std::pair<libtorrent::digest32<256l>const,std::basic_string_view<char,std::char_traits<char>>>>,std::less<libtorrent::digest32<256l>>,std::allocator<std::pair<libtorrent::digest32<256l>const,std::basic_string_view<char,std::char_traits<char>>>>>
                  *)&local_a0,&local_70,&local_130);
    }
    if (local_120.second.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.second.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.second.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.second.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar15 = iVar15 + 1;
  } while ((_Rb_tree_header *)iVar7._M_node != &local_d0._M_impl.super__Rb_tree_header);
LAB_0036961a:
  bVar11 = false;
  goto LAB_0036961c;
LAB_00369696:
  do {
    fVar12.m_val = (int)iVar8._begin.m_val;
    iVar6 = file_storage::file_size(this_01._M_head_impl,fVar12);
    if (((file_storage *)&(this_01._M_head_impl)->m_piece_length)->m_piece_length < iVar6) {
      file_storage::root((sha256_hash *)&local_120,this_01._M_head_impl,fVar12);
      iVar9 = ::std::
              _Rb_tree<libtorrent::digest32<256L>,_std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::_Select1st<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              ::find(&local_a0,(key_type *)&local_120);
      if ((_Rb_tree_header *)iVar9._M_node != &local_a0._M_impl.super__Rb_tree_header) {
        iVar15 = file_storage::file_num_pieces(this_01._M_head_impl,fVar12);
        uVar1 = *(ulong *)(iVar9._M_node + 2);
        if (uVar1 == (long)iVar15 * 0x20) {
          if ((uVar1 & 0x1f) == 0) {
            ::std::vector<char,std::allocator<char>>::_M_assign_aux<char_const*>
                      ((vector<char,std::allocator<char>> *)
                       ((long)&(((this->m_piece_layers).
                                 super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 .
                                 super__Vector_base<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_vector<char,_std::allocator<char>_>).
                               super__Vector_base<char,_std::allocator<char>_> + lVar13),
                       iVar9._M_node[2]._M_parent,
                       (long)&(iVar9._M_node[2]._M_parent)->_M_color + uVar1);
            goto LAB_0036970d;
          }
          eVar17 = errors::make_error_code(torrent_invalid_piece_layer);
        }
        else {
          eVar17 = errors::make_error_code(torrent_invalid_piece_layer);
        }
        *ec = eVar17;
        goto LAB_0036961a;
      }
    }
LAB_0036970d:
    iVar8._begin.m_val = fVar12.m_val + 1;
    iVar8._end.m_val = 0;
    lVar13 = lVar13 + 0x18;
  } while (sVar14.m_val != iVar8._begin.m_val);
LAB_0036971d:
  (this->m_flags).m_val = (this->m_flags).m_val | 0x10;
  bVar11 = true;
LAB_0036961c:
  ::std::
  _Rb_tree<libtorrent::digest32<256L>,_libtorrent::digest32<256L>,_std::_Identity<libtorrent::digest32<256L>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<libtorrent::digest32<256L>_>_>
  ::~_Rb_tree(&local_d0);
LAB_00369626:
  ::std::
  _Rb_tree<libtorrent::digest32<256L>,_std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::_Select1st<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::less<libtorrent::digest32<256L>_>,_std::allocator<std::pair<const_libtorrent::digest32<256L>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~_Rb_tree(&local_a0);
  return bVar11;
}

Assistant:

bool torrent_info::parse_piece_layers(bdecode_node const& e, error_code& ec)
	{
		std::map<sha256_hash, string_view> piece_layers;

		if (e.type() != bdecode_node::dict_t)
		{
			ec = errors::torrent_missing_piece_layer;
			return false;
		}

		std::set<sha256_hash> all_file_roots;
		auto const& fs = orig_files();
		for (file_index_t i : fs.file_range())
		{
			if (fs.file_size(i) <= fs.piece_length())
				continue;
			all_file_roots.insert(fs.root(i));
		}

		for (int i = 0; i < e.dict_size(); ++i)
		{
			auto const f = e.dict_at(i);
			if (f.first.size() != static_cast<std::size_t>(sha256_hash::size())
				|| f.second.type() != bdecode_node::string_t
				|| f.second.string_length() % sha256_hash::size() != 0)
			{
				ec = errors::torrent_invalid_piece_layer;
				return false;
			}

			sha256_hash const root(f.first);
			if (all_file_roots.find(root) == all_file_roots.end())
			{
				// This piece layer doesn't refer to any file in this torrent
				ec = errors::torrent_invalid_piece_layer;
				return false;
			}

			piece_layers.emplace(sha256_hash(f.first), f.second.string_value());
		}

		m_piece_layers.resize(fs.num_files());

		for (file_index_t i : fs.file_range())
		{
			if (fs.file_size(i) <= fs.piece_length())
				continue;

			auto const piece_layer = piece_layers.find(fs.root(i));
			if (piece_layer == piece_layers.end()) continue;

			int const num_pieces = fs.file_num_pieces(i);

			if (ptrdiff_t(piece_layer->second.size()) != num_pieces * sha256_hash::size())
			{
				ec = errors::torrent_invalid_piece_layer;
				return false;
			}

			auto const hashes = piece_layer->second;
			if ((hashes.size() % sha256_hash::size()) != 0)
			{
				ec = errors::torrent_invalid_piece_layer;
				return false;
			}

			m_piece_layers[i].assign(hashes.begin(), hashes.end());
		}

		m_flags |= v2_has_piece_hashes;
		return true;
	}